

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_mtllib_after_g_Test::~utObjImportExport_mtllib_after_g_Test
          (utObjImportExport_mtllib_after_g_Test *this)

{
  utObjImportExport_mtllib_after_g_Test *this_local;
  
  ~utObjImportExport_mtllib_after_g_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utObjImportExport, mtllib_after_g ) {
    ::Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/cube_mtllib_after_g.obj", aiProcess_ValidateDataStructure );
    ASSERT_NE( nullptr, scene );

    EXPECT_EQ(scene->mNumMeshes, 1U);
    const aiMesh *mesh = scene->mMeshes[0];
    const aiMaterial* mat = scene->mMaterials[mesh->mMaterialIndex];
    aiString name;
    ASSERT_EQ(aiReturn_SUCCESS, mat->Get(AI_MATKEY_NAME, name));
    EXPECT_STREQ("MyMaterial", name.C_Str());
}